

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_value.c
# Opt level: O0

int mpt_print_value(mpt_value *val,_func_ssize_t_void_ptr_char_ptr_size_t *save,void *dest)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  mpt_type_traits *pmVar5;
  size_t sVar6;
  uint local_1cc;
  int local_1c8;
  int local_1c4;
  undefined1 local_1c0 [8];
  mpt_value pos;
  mpt_object **ppmStack_1a8;
  int step;
  char *str_1;
  size_t max;
  size_t size;
  size_t i;
  uint8_t *data;
  int total;
  iovec *vec;
  mpt_type_traits *traits;
  mpt_convertable *conv;
  mpt_object *obj;
  char buf [256];
  int local_4c;
  int adv;
  int curr;
  int type;
  size_t len;
  char *str;
  void *ptr;
  void *dest_local;
  _func_ssize_t_void_ptr_char_ptr_size_t *save_local;
  mpt_value *val_local;
  
  str = (char *)val->_addr;
  if (str == (char *)0x0) {
    val_local._4_4_ = -2;
  }
  else {
    iVar4 = (int)val->_type;
    ptr = dest;
    dest_local = save;
    save_local = (_func_ssize_t_void_ptr_char_ptr_size_t *)val;
    if (iVar4 == 0x84) {
      if (*(mpt_object **)str == (mpt_object *)0x0) {
        local_1c4 = 0;
      }
      else {
        local_1c4 = mpt_print_object(*(mpt_object **)str,save,dest);
      }
      val_local._4_4_ = local_1c4;
    }
    else if (iVar4 == 0x80) {
      if (*(mpt_convertable **)str == (mpt_convertable *)0x0) {
        local_1c8 = 0;
      }
      else {
        local_1c8 = mpt_print_convertable(*(mpt_convertable **)str,save,dest);
      }
      val_local._4_4_ = local_1c8;
    }
    else {
      len = (size_t)mpt_data_tostring(&str,(long)iVar4,(size_t *)&curr);
      if ((char *)len == (char *)0x0) {
        if ((iVar4 < 0x40) || (0x59 < iVar4)) {
          local_1cc = 0;
        }
        else {
          local_1cc = iVar4 + 0x20U & 0xff;
        }
        if (local_1cc == 0) {
          val_local._4_4_ =
               mpt_number_tostring((mpt_value *)save_local,(mpt_value_format)0x0,(char *)&obj,0x100)
          ;
          if (-1 < val_local._4_4_) {
            val_local._4_4_ = (*(code *)dest_local)(ptr,&obj,(long)val_local._4_4_);
          }
        }
        else {
          pmVar5 = mpt_type_traits((long)(int)local_1cc);
          pcVar3 = str;
          if ((pmVar5 == (mpt_type_traits *)0x0) || (pmVar5->size == 0)) {
            val_local._4_4_ = -3;
          }
          else {
            data._4_4_ = (*(code *)dest_local)(ptr,"[ ",2);
            if (data._4_4_ < 2) {
              val_local._4_4_ = -0x11;
            }
            else {
              if (pcVar3 != (char *)0x0) {
                i = *(size_t *)pcVar3;
                uVar1 = pmVar5->size;
                uVar2 = *(ulong *)(pcVar3 + 8);
                for (size = 0; size < uVar2 / uVar1; size = size + 1) {
                  if (local_1cc == 0x73) {
                    ppmStack_1a8 = *(mpt_object ***)i;
                    if (ppmStack_1a8 == (mpt_object **)0x0) {
                      local_4c = 0;
                      ppmStack_1a8 = (mpt_object **)0x13102e;
                    }
                    else {
                      sVar6 = strlen((char *)ppmStack_1a8);
                      local_4c = (int)sVar6;
                    }
                  }
                  else {
                    local_1c0 = (undefined1  [8])i;
                    pos._addr = (void *)(long)(int)local_1cc;
                    local_4c = mpt_number_tostring((mpt_value *)local_1c0,(mpt_value_format)0x0,
                                                   (char *)&obj,0x100);
                    if (local_4c < 0) {
                      return local_4c;
                    }
                    ppmStack_1a8 = &obj;
                  }
                  pos._type._4_4_ = (*(code *)dest_local)(ptr,ppmStack_1a8,(long)local_4c);
                  if (pos._type._4_4_ < local_4c) {
                    return -0x11;
                  }
                  iVar4 = pos._type._4_4_ + data._4_4_;
                  pos._type._4_4_ = (*(code *)dest_local)(ptr," ",1);
                  if (pos._type._4_4_ < 1) {
                    return -0x11;
                  }
                  data._4_4_ = pos._type._4_4_ + iVar4;
                  i = uVar1 + i;
                }
              }
              iVar4 = (*(code *)dest_local)(ptr,"]",1);
              if (iVar4 < 0) {
                val_local._4_4_ = -0x11;
              }
              else {
                val_local._4_4_ = data._4_4_ + iVar4;
              }
            }
          }
        }
      }
      else {
        val_local._4_4_ = (*(code *)dest_local)(ptr,len,_curr);
      }
    }
  }
  return val_local._4_4_;
}

Assistant:

extern int mpt_print_value(const MPT_STRUCT(value) *val, ssize_t (*save)(void *, const char *, size_t), void *dest)
{
	static const MPT_STRUCT(value_format) vfmt = MPT_VALFMT_INIT;
	const void *ptr;
	const char *str;
	size_t len;
	int type, curr, adv;
	char buf[256];
	
	/* missing content */
	if (!(ptr = val->_addr)) {
		return MPT_ERROR(BadValue);
	}
	/* object type */
	type = val->_type;
	if (type == MPT_ENUM(TypeObjectPtr)) {
		const MPT_INTERFACE(object) *obj = *(const void **) ptr;
		return obj ? mpt_print_object(obj, save, dest) : 0;
	}
	/* convertable type */
	if (type == MPT_ENUM(TypeConvertablePtr)) {
		MPT_INTERFACE(convertable) *conv = *(void **) ptr;
		return conv ? mpt_print_convertable(conv, save, dest) : 0;
	}
	if ((str = mpt_data_tostring(&ptr, type, &len))) {
		return save(dest, str, len);
	}
	/* vector representation in value */
	if ((curr = MPT_type_toScalar(type)) > 0) {
		const MPT_STRUCT(type_traits) *traits = mpt_type_traits(curr);
		const struct iovec *vec = ptr;
		int total;
		if (!traits || !traits->size) {
			return MPT_ERROR(BadType);
		}
		if ((total = save(dest, "[ ", 2)) < 2) {
			return MPT_ERROR(MissingBuffer);
		}
		if (vec) {
			const uint8_t *data = vec->iov_base;
			size_t i, size = traits->size, max = vec->iov_len / size;
			
			for (i = 0; i < max; i++) {
				const char *str;
				int step;
				if (curr == 's') {
					if ((str = *((const char **) data))) {
						adv = strlen(str);
					}
					else {
						adv = 0;
						str = "";
					}
				}
				else {
					MPT_STRUCT(value) pos = MPT_VALUE_INIT(curr, data);
					adv = mpt_number_tostring(&pos, vfmt, buf, sizeof(buf));
					if (adv < 0) {
						return adv;
					}
					str = buf;
				}
				if ((step = save(dest, str, adv)) < adv) {
					return MPT_ERROR(MissingBuffer);
				}
				total += step;
				if ((step = save(dest, " ", 1)) < 1) {
					return MPT_ERROR(MissingBuffer);
				}
				total += step;
				data  += size;
			}
		}
		if ((adv = save(dest, "]", 1)) < 0) {
			return MPT_ERROR(MissingBuffer);
		}
		return total + adv;
	}
	/* represent numeric value */
	if ((adv = mpt_number_tostring(val, vfmt, buf, sizeof(buf))) >= 0) {
		return save(dest, buf, adv);
	}
	return adv;
}